

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void mpt_copy_df(int pts,double *src,int lds,float *dest,int ldd)

{
  int local_34;
  int local_30;
  int j;
  int i;
  int ldd_local;
  float *dest_local;
  int lds_local;
  double *src_local;
  int pts_local;
  
  if (0 < pts) {
    if (ldd == 0) {
      *dest = (float)src[(pts + -1) * lds];
    }
    else if (lds == 0) {
      for (local_30 = 0; local_30 < pts; local_30 = local_30 + 1) {
        dest[local_30] = (float)*src;
      }
    }
    else if ((lds == 1) && (ldd == 1)) {
      for (local_30 = 0; local_30 < pts; local_30 = local_30 + 1) {
        dest[local_30] = (float)src[local_30];
      }
    }
    else {
      local_30 = 0;
      local_34 = 0;
      src_local._4_4_ = pts;
      while (src_local._4_4_ != 0) {
        dest[local_30] = (float)src[local_34];
        local_30 = ldd + local_30;
        local_34 = lds + local_34;
        src_local._4_4_ = src_local._4_4_ + -1;
      }
    }
  }
  return;
}

Assistant:

extern void MPT_COPY_FCN(int pts, const MPT_COPY_ST *src, int lds, MPT_COPY_DT *dest, int ldd)
{
	int i, j;
	
	if (pts <= 0) {
		return;
	}
	if (!ldd) {
		dest[0] = src[(pts - 1) * lds];
		return;
	}
	if (!lds) {
		for (i = 0; i < pts; i++) {
			dest[i] = src[0];
		}
		return;
	}
	if (lds == 1 && ldd == 1) {
		for (i = 0; i < pts; i++) {
			dest[i] = src[i];
		}
		return;
	}
	for (i = 0, j = 0; pts--; i += ldd, j += lds) {
		dest[i] = src[j];
	}
}